

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_cam_b3lyp.c
# Opt level: O0

void camb3_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  xc_func_type *p_00;
  double dVar1;
  xc_func_type *p_01;
  char *name;
  double ac;
  double omega;
  double beta;
  double alpha;
  double *in_stack_ffffffffffffffc8;
  
  p_00 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,0);
  dVar1 = get_ext_param(in_RDI,in_RSI,1);
  p_01 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,2);
  name = (char *)get_ext_param(in_RDI,in_RSI,3);
  *in_RDI->mix_coef = 1.0 - dVar1;
  in_RDI->mix_coef[1] = -(double)p_01;
  in_RDI->mix_coef[2] = 1.0 - (double)p_00;
  in_RDI->mix_coef[3] = (double)p_00;
  xc_func_set_ext_params_name(p_01,name,(double)p_00);
  set_ext_params_cam(p_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void
camb3_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega, ac;

  assert(p != NULL);
  ac     = get_ext_param(p, ext_params, 0);
  alpha  = get_ext_param(p, ext_params, 1);
  beta   = get_ext_param(p, ext_params, 2);
  omega  = get_ext_param(p, ext_params, 3);

  p->mix_coef[0] = 1.0 - alpha;
  p->mix_coef[1] = -beta;
  p->mix_coef[2] = 1.0 - ac;
  p->mix_coef[3] = ac;

  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega);
  set_ext_params_cam(p, ext_params);
}